

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O0

void __thiscall
QUrlModel::setUrl(QUrlModel *this,QModelIndex *index,QUrl *url,QModelIndex *dirIndex)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  ulong uVar4;
  QWidget *pQVar5;
  long lVar6;
  long lVar7;
  QUrl *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *pQVar8;
  qreal dpr;
  QWidget *widget;
  QAbstractFileIconProvider *provider;
  QIcon oldIcon;
  QPixmap newPixmap;
  QPixmap smallPixmap;
  QSize size;
  QIcon newIcon;
  QString newName;
  QObject *in_stack_fffffffffffffca8;
  QModelIndex *in_stack_fffffffffffffcb0;
  QIcon *in_stack_fffffffffffffcb8;
  undefined8 uVar9;
  undefined4 in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  uint arole;
  QModelIndex *in_stack_fffffffffffffcc8;
  QIcon local_2b8 [4];
  undefined1 *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  undefined1 local_280 [8];
  undefined1 *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 local_260 [8];
  undefined1 *local_258;
  undefined1 local_250 [24];
  QFileInfo local_238 [32];
  QIcon local_218;
  QIcon local_210 [7];
  undefined1 local_1d8 [24];
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 local_1a0 [24];
  QVariant local_188;
  QVariant local_168;
  QVariant local_148;
  QVariant local_128;
  QVariant local_108;
  QVariant local_e8;
  QVariant local_c8;
  QVariant local_a8;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ::QVariant::QVariant(&local_28,in_RDX);
  (**(code **)(*in_RDI + 0x98))(in_RDI,in_RSI,&local_28,0x101);
  ::QVariant::~QVariant(&local_28);
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffcb0,
             (ComponentFormattingOption)((ulong)in_stack_fffffffffffffca8 >> 0x20));
  QUrl::path((QFlags_conflict1 *)local_1a0);
  bVar1 = QString::isEmpty((QString *)0x7853ad);
  QString::~QString((QString *)0x7853be);
  if (bVar1) {
    QFileSystemModel::myComputer((int)&local_48);
    (**(code **)(*in_RDI + 0x98))(in_RDI,in_RSI,&local_48,2);
    ::QVariant::~QVariant(&local_48);
    QFileSystemModel::myComputer((int)&local_68);
    (**(code **)(*in_RDI + 0x98))(in_RDI,in_RSI,&local_68,1);
    ::QVariant::~QVariant(&local_68);
  }
  else {
    local_1c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x7854b1);
    if ((*(byte *)(in_RDI + 2) & 1) == 0) {
      QModelIndex::data(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4);
      ::QVariant::toString();
      QString::operator=((QString *)in_stack_fffffffffffffcb0,(QString *)in_stack_fffffffffffffca8);
      QString::~QString((QString *)0x785590);
      ::QVariant::~QVariant(&local_a8);
    }
    else {
      QModelIndex::data(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4);
      ::QVariant::toString();
      QDir::toNativeSeparators((QString *)local_1d8);
      QString::operator=((QString *)in_stack_fffffffffffffcb0,(QString *)in_stack_fffffffffffffca8);
      QString::~QString((QString *)0x785526);
      QString::~QString((QString *)0x785533);
      ::QVariant::~QVariant(&local_88);
    }
    local_210[0].d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::data(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4);
    qvariant_cast<QIcon>((QVariant *)in_stack_fffffffffffffcc8);
    ::QVariant::~QVariant(&local_c8);
    bVar1 = QModelIndex::isValid(in_stack_fffffffffffffcb0);
    if (bVar1) {
      ::QVariant::QVariant(&local_108,true);
      (**(code **)(*in_RDI + 0x98))(in_RDI,in_RSI,&local_108,0x102);
      ::QVariant::~QVariant(&local_108);
    }
    else {
      plVar3 = (long *)QFileSystemModel::iconProvider();
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x10))(&local_218,plVar3,5);
        QIcon::operator=((QIcon *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                         in_stack_fffffffffffffcb8);
        QIcon::~QIcon(&local_218);
      }
      QUrl::toLocalFile();
      QFileInfo::QFileInfo(local_238,(QString *)local_250);
      QFileInfo::fileName();
      QString::operator=((QString *)in_stack_fffffffffffffcb0,(QString *)in_stack_fffffffffffffca8);
      QString::~QString((QString *)0x7856b3);
      QFileInfo::~QFileInfo(local_238);
      QString::~QString((QString *)0x7856cd);
      bVar1 = QListSpecialMethodsBase<QUrl>::contains<QUrl>
                        ((QListSpecialMethodsBase<QUrl> *)in_stack_fffffffffffffcb0,
                         (QUrl *)in_stack_fffffffffffffca8);
      if (!bVar1) {
        QList<QUrl>::append((QList<QUrl> *)in_stack_fffffffffffffcb0,
                            (parameter_type)in_stack_fffffffffffffca8);
      }
      ::QVariant::QVariant(&local_e8,false);
      (**(code **)(*in_RDI + 0x98))(in_RDI,in_RSI,&local_e8,0x102);
      ::QVariant::~QVariant(&local_e8);
    }
    uVar4 = QIcon::isNull();
    if ((uVar4 & 1) == 0) {
      local_258 = &DAT_aaaaaaaaaaaaaaaa;
      QSize::QSize((QSize *)in_stack_fffffffffffffcb0,
                   (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),(int)in_stack_fffffffffffffca8);
      local_258 = (undefined1 *)QIcon::actualSize((QSize *)local_210,(Mode)local_260,On);
      iVar2 = QSize::width((QSize *)0x7857fd);
      if (iVar2 < 0x20) {
        QObject::parent((QObject *)0x785810);
        pQVar5 = qobject_cast<QWidget*>(in_stack_fffffffffffffca8);
        if (pQVar5 == (QWidget *)0x0) {
          QCoreApplication::instance();
          pQVar8 = (QModelIndex *)QGuiApplication::devicePixelRatio();
        }
        else {
          pQVar8 = (QModelIndex *)QPaintDevice::devicePixelRatio();
        }
        local_278 = &DAT_aaaaaaaaaaaaaaaa;
        local_270 = &DAT_aaaaaaaaaaaaaaaa;
        local_268 = &DAT_aaaaaaaaaaaaaaaa;
        in_stack_fffffffffffffcc8 = pQVar8;
        QSize::QSize((QSize *)in_stack_fffffffffffffcb0,
                     (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),(int)in_stack_fffffffffffffca8)
        ;
        QIcon::pixmap((QSize *)&local_278,(double)pQVar8,(Mode)local_210,(State)local_280);
        local_298 = &DAT_aaaaaaaaaaaaaaaa;
        local_290 = &DAT_aaaaaaaaaaaaaaaa;
        local_288 = &DAT_aaaaaaaaaaaaaaaa;
        QPixmap::scaledToWidth((int)&local_298,(TransformationMode)&local_278);
        QIcon::addPixmap((QPixmap *)local_210,(Mode)&local_298,On);
        QPixmap::~QPixmap((QPixmap *)&local_298);
        QPixmap::~QPixmap((QPixmap *)&local_278);
      }
    }
    QModelIndex::data(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4);
    ::QVariant::toString();
    bVar1 = ::operator!=((QString *)in_stack_fffffffffffffcb0,(QString *)in_stack_fffffffffffffca8);
    arole = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcc4);
    QString::~QString((QString *)0x7859a9);
    ::QVariant::~QVariant(&local_128);
    if ((arole & 0x1000000) != 0) {
      uVar9 = in_RSI;
      ::QVariant::QVariant(&local_148,(QString *)&local_1c0);
      (**(code **)(*in_RDI + 0x98))(in_RDI,uVar9,&local_148,2);
      ::QVariant::~QVariant(&local_148);
    }
    local_2b8[0].d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::data(in_stack_fffffffffffffcc8,arole);
    qvariant_cast<QIcon>((QVariant *)in_stack_fffffffffffffcc8);
    ::QVariant::~QVariant(&local_168);
    lVar6 = QIcon::cacheKey();
    lVar7 = QIcon::cacheKey();
    if (lVar6 != lVar7) {
      QIcon::operator_cast_to_QVariant((QIcon *)&local_188);
      (**(code **)(*in_RDI + 0x98))(in_RDI,in_RSI,&local_188,1);
      ::QVariant::~QVariant(&local_188);
    }
    QIcon::~QIcon(local_2b8);
    QIcon::~QIcon(local_210);
    QString::~QString((QString *)0x785afa);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUrlModel::setUrl(const QModelIndex &index, const QUrl &url, const QModelIndex &dirIndex)
{
    setData(index, url, UrlRole);
    if (url.path().isEmpty()) {
        setData(index, fileSystemModel->myComputer());
        setData(index, fileSystemModel->myComputer(Qt::DecorationRole), Qt::DecorationRole);
    } else {
        QString newName;
        if (showFullPath) {
            //On windows the popup display the "C:\", convert to nativeSeparators
            newName = QDir::toNativeSeparators(dirIndex.data(QFileSystemModel::FilePathRole).toString());
        } else {
            newName = dirIndex.data().toString();
        }

        QIcon newIcon = qvariant_cast<QIcon>(dirIndex.data(Qt::DecorationRole));
        if (!dirIndex.isValid()) {
            const QAbstractFileIconProvider *provider = fileSystemModel->iconProvider();
            if (provider)
                newIcon = provider->icon(QAbstractFileIconProvider::Folder);
            newName = QFileInfo(url.toLocalFile()).fileName();
            if (!invalidUrls.contains(url))
                invalidUrls.append(url);
            //The bookmark is invalid then we set to false the EnabledRole
            setData(index, false, EnabledRole);
        } else {
            //The bookmark is valid then we set to true the EnabledRole
            setData(index, true, EnabledRole);
        }

        // newIcon could be null if fileSystemModel->iconProvider() returns null
        if (!newIcon.isNull()) {
        // Make sure that we have at least 32x32 images
            const QSize size = newIcon.actualSize(QSize(32,32));
            if (size.width() < 32) {
                const auto widget = qobject_cast<QWidget *>(parent());
                const auto dpr = widget ? widget->devicePixelRatio() : qApp->devicePixelRatio();
                const auto smallPixmap = newIcon.pixmap(QSize(32, 32), dpr);
                const auto newPixmap = smallPixmap.scaledToWidth(32 * dpr, Qt::SmoothTransformation);
                newIcon.addPixmap(newPixmap);
            }
        }

        if (index.data().toString() != newName)
            setData(index, newName);
        QIcon oldIcon = qvariant_cast<QIcon>(index.data(Qt::DecorationRole));
        if (oldIcon.cacheKey() != newIcon.cacheKey())
            setData(index, newIcon, Qt::DecorationRole);
    }
}